

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

StructNew * __thiscall
wasm::Builder::makeStructNew(Builder *this,HeapType type,ExpressionList *args)

{
  Type local_30;
  StructNew *local_28;
  StructNew *ret;
  ExpressionList *args_local;
  Builder *this_local;
  HeapType type_local;
  
  ret = (StructNew *)args;
  args_local = (ExpressionList *)this;
  this_local = (Builder *)type.id;
  local_28 = MixedArena::alloc<wasm::StructNew>(&this->wasm->allocator);
  ArenaVector<wasm::Expression_*>::operator=
            (&local_28->operands,(ArenaVector<wasm::Expression_*> *)ret);
  wasm::Type::Type(&local_30,(HeapType)this_local,NonNullable,Inexact);
  (local_28->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_30.id;
  StructNew::finalize(local_28);
  return local_28;
}

Assistant:

StructNew* makeStructNew(HeapType type, ExpressionList&& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands = std::move(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }